

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::strTree<char_const*&,char_const(&)[7],kj::String&,char,kj::String&,char_const(&)[3]>
          (StringTree *__return_storage_ptr__,kj *this,char **params,char (*params_1) [7],
          String *params_2,char *params_3,String *params_4,char (*params_5) [3])

{
  char *pcVar1;
  Branch *pBVar2;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 uVar3;
  ArrayPtr<const_char> local_78;
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  Branch *local_38;
  char *local_30;
  
  local_58 = toCharSequence<char_const*&>((char **)this);
  local_68 = toCharSequence<char_const(&)[7]>((char (*) [7])params);
  pcVar1 = *(char **)(params_1[1] + 1);
  local_78.ptr = pcVar1;
  if (pcVar1 != (char *)0x0) {
    local_78.ptr = *(char **)params_1;
  }
  local_78.size_ = (size_t)(pcVar1 + -1);
  if (pcVar1 == (char *)0x0) {
    local_78.size_ = (size_t)(char *)0x0;
  }
  uVar3 = *(undefined1 *)&(params_2->content).ptr;
  pBVar2 = *(Branch **)(params_3 + 8);
  local_38 = pBVar2;
  if (pBVar2 != (Branch *)0x0) {
    local_38 = *(Branch **)params_3;
  }
  local_30 = (char *)((long)&pBVar2[-1].content.branches.disposer + 7);
  if (pBVar2 == (Branch *)0x0) {
    local_30 = (char *)0x0;
  }
  local_48 = toCharSequence<char_const(&)[3]>((char (*) [3])params_4);
  StringTree::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)&local_58,&local_68,&local_78,
             (ArrayPtr<const_char> *)&stack0xffffffffffffff87,(FixedArray<char,_1UL> *)&local_38,
             &local_48,(ArrayPtr<const_char> *)CONCAT17(uVar3,in_stack_ffffffffffffff80));
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}